

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlAttrPtr xmlCopyPropList(xmlNodePtr target,xmlAttrPtr cur)

{
  xmlAttrPtr pxVar1;
  xmlAttrPtr pxVar2;
  xmlAttrPtr pxVar3;
  xmlAttrPtr pxVar4;
  
  if (target == (xmlNodePtr)0x0) {
    if (cur != (xmlAttrPtr)0x0) goto LAB_001842c2;
  }
  else if (cur != (xmlAttrPtr)0x0 && target->type == XML_ELEMENT_NODE) {
LAB_001842c2:
    pxVar3 = (xmlAttrPtr)0x0;
    pxVar4 = (xmlAttrPtr)0x0;
    do {
      pxVar1 = xmlCopyPropInternal((xmlDocPtr)0x0,target,cur);
      if (pxVar1 == (xmlAttrPtr)0x0) {
        return (xmlAttrPtr)0x0;
      }
      pxVar2 = pxVar1;
      if (pxVar4 != (xmlAttrPtr)0x0) {
        pxVar4->next = pxVar1;
        pxVar1->prev = pxVar4;
        pxVar2 = pxVar3;
      }
      cur = cur->next;
      pxVar3 = pxVar2;
      pxVar4 = pxVar1;
    } while (cur != (_xmlAttr *)0x0);
    return pxVar2;
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

xmlAttrPtr
xmlCopyPropList(xmlNodePtr target, xmlAttrPtr cur) {
    xmlAttrPtr ret = NULL;
    xmlAttrPtr p = NULL,q;

    if ((target != NULL) && (target->type != XML_ELEMENT_NODE))
        return(NULL);
    while (cur != NULL) {
        q = xmlCopyProp(target, cur);
	if (q == NULL)
	    return(NULL);
	if (p == NULL) {
	    ret = p = q;
	} else {
	    p->next = q;
	    q->prev = p;
	    p = q;
	}
	cur = cur->next;
    }
    return(ret);
}